

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_binary_constructor
              (AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  _Bool use_smallest_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (use_smallest) {
    iVar1 = output_byte(encoder_output,context,0xa0);
    if (iVar1 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_binary_constructor",0xd4b,1,"Failed encoding small binary constructor");
      }
      l._0_4_ = 0xd4c;
    }
  }
  else {
    iVar1 = output_byte(encoder_output,context,0xb0);
    if (iVar1 == 0) {
      l._0_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"encode_binary_constructor",0xd5a,1,"Failed encoding large binary constructor");
      }
      l._0_4_ = 0xd5b;
    }
  }
  return (int)l;
}

Assistant:

static int encode_binary_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, bool use_smallest)
{
    int result;
    if (use_smallest)
    {
        /* Codes_SRS_AMQPVALUE_01_297: [<encoding name="vbin8" code="0xa0" category="variable" width="1" label="up to 2^8 - 1 octets of binary data"/>] */
        if (output_byte(encoder_output, context, 0xA0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small binary constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_298: [<encoding name="vbin32" code="0xb0" category="variable" width="4" label="up to 2^32 - 1 octets of binary data"/>] */
        if (output_byte(encoder_output, context, 0xB0) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding large binary constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}